

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

bool __thiscall TestClass::SyncRetFunc2(TestClass *this,uint64_t *p1,uint32_t p2)

{
  ulong uVar1;
  SyncRetEventAgent2<TestClass,_bool,_unsigned_long_&,_unsigned_int> *this_00;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  uint param2;
  SyncRetEventAgent2<TestClass,_bool,_unsigned_long_&,_unsigned_int> *agent;
  bool result;
  uint32_t p2_local;
  uint64_t *p1_local;
  TestClass *this_local;
  
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent2<TestClass,_bool,_unsigned_long_&,_unsigned_int> *)
              operator_new(0x40,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                           ,0x10a);
    __n = 0;
    param2 = (uint)p1;
    SyncRetEventAgent2<TestClass,_bool,_unsigned_long_&,_unsigned_int>::SyncRetEventAgent2
              (this_00,this,0x10d350,(unsigned_long *)0x0,param2);
    sVar2 = SyncRetEventAgent<bool>::send
                      ((SyncRetEventAgent<bool> *)this_00,(int)this + 8,__buf,__n,param2);
    this_local._7_1_ = (bool)((byte)sVar2 & 1);
  }
  else {
    *p1 = *p1 + 0x400;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SyncRetFunc2(uint64_t &p1, uint32_t p2)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent2<TestClass, bool, uint64_t &, uint32_t>* agent =
				jh_new SyncRetEventAgent2<TestClass, bool, uint64_t &, uint32_t>(this, &TestClass::SyncRetFunc2,
					p1, p2);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u)", result, p1, p2);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u)", p1, p2);
		p1+=1024;
		p2+=512;
		return true;
	}